

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Poppify.cpp
# Opt level: O0

void __thiscall
wasm::anon_unknown_18::Poppifier::emitTupleExtract(Poppifier *this,TupleExtract *curr)

{
  Type TVar1;
  Index index;
  reference pvVar2;
  Type *pTVar3;
  Expression *pEVar4;
  LocalGet *local_88;
  uintptr_t local_80;
  Drop *local_78;
  size_t local_70;
  size_t i_1;
  LocalSet *local_60;
  uintptr_t local_58;
  Index local_4c;
  Type TStack_48;
  Index scratch;
  Type type;
  Drop *local_38;
  ulong local_30;
  size_t i;
  Type types;
  vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *instrs;
  TupleExtract *curr_local;
  Poppifier *this_local;
  
  pvVar2 = std::
           vector<wasm::(anonymous_namespace)::Poppifier::Scope,_std::allocator<wasm::(anonymous_namespace)::Poppifier::Scope>_>
           ::back(&this->scopeStack);
  types.id = (uintptr_t)&pvVar2->instrs;
  i = (curr->tuple->type).id;
  local_30 = wasm::Type::size((Type *)&i);
  while (TVar1.id = types.id, local_30 = local_30 - 1, curr->index < local_30) {
    pTVar3 = wasm::Type::operator[]((Type *)&i,local_30);
    type.id = pTVar3->id;
    pEVar4 = (Expression *)Builder::makePop(&this->builder,type);
    local_38 = Builder::makeDrop(&this->builder,pEVar4);
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)TVar1.id,
               (value_type *)&local_38);
  }
  if (curr->index != 0) {
    pTVar3 = wasm::Type::operator[]((Type *)&i,(ulong)curr->index);
    local_58 = pTVar3->id;
    TStack_48.id = local_58;
    index = getScratchLocal(this,(Type)local_58);
    TVar1 = types;
    i_1 = TStack_48.id;
    local_4c = index;
    pEVar4 = (Expression *)Builder::makePop(&this->builder,TStack_48);
    local_60 = Builder::makeLocalSet(&this->builder,index,pEVar4);
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)TVar1.id,
               (value_type *)&local_60);
    for (local_70 = (size_t)(curr->index - 1); TVar1.id = types.id, local_70 != 0xffffffffffffffff;
        local_70 = local_70 - 1) {
      pTVar3 = wasm::Type::operator[]((Type *)&i,local_70);
      local_80 = pTVar3->id;
      pEVar4 = (Expression *)Builder::makePop(&this->builder,(Type)local_80);
      local_78 = Builder::makeDrop(&this->builder,pEVar4);
      std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
                ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)TVar1.id,
                 (value_type *)&local_78);
    }
    local_88 = Builder::makeLocalGet(&this->builder,local_4c,TStack_48);
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)TVar1.id,
               (value_type *)&local_88);
  }
  return;
}

Assistant:

void Poppifier::emitTupleExtract(TupleExtract* curr) {
  auto& instrs = scopeStack.back().instrs;
  auto types = curr->tuple->type;
  // Drop all the values after the one we want
  for (size_t i = types.size() - 1; i > curr->index; --i) {
    instrs.push_back(builder.makeDrop(builder.makePop(types[i])));
  }
  // If the extracted value is the only one left, we're done
  if (curr->index == 0) {
    return;
  }
  // Otherwise, save it to a scratch local and drop the other values
  auto type = types[curr->index];
  Index scratch = getScratchLocal(type);
  instrs.push_back(builder.makeLocalSet(scratch, builder.makePop(type)));
  for (size_t i = curr->index - 1; i != size_t(-1); --i) {
    instrs.push_back(builder.makeDrop(builder.makePop(types[i])));
  }
  // Retrieve the saved value
  instrs.push_back(builder.makeLocalGet(scratch, type));
}